

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

void __thiscall llvm::SourceMgr::SrcBuffer::~SrcBuffer(SrcBuffer *this)

{
  ulong uVar1;
  void *pvVar2;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Var3;
  pointer *__ptr;
  undefined8 *puVar4;
  
  uVar1 = (this->OffsetCache).Val.Val.Value;
  if (7 < uVar1) {
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffff8);
    if ((puVar4 != (undefined8 *)0x0) && (pvVar2 = (void *)*puVar4, pvVar2 != (void *)0x0)) {
      operator_delete(pvVar2,puVar4[2] - (long)pvVar2);
    }
    operator_delete(puVar4,0x18);
    (this->OffsetCache).Val.Val.Value = 0;
  }
  _Var3._M_head_impl =
       (this->Buffer)._M_t.
       super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
       super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
       super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (MemoryBuffer *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_MemoryBuffer + 8))();
  }
  (this->Buffer)._M_t.
  super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = (MemoryBuffer *)0x0;
  return;
}

Assistant:

SourceMgr::SrcBuffer::~SrcBuffer() {
  if (!OffsetCache.isNull()) {
    if (OffsetCache.is<std::vector<uint8_t>*>())
      delete OffsetCache.get<std::vector<uint8_t>*>();
    else if (OffsetCache.is<std::vector<uint16_t>*>())
      delete OffsetCache.get<std::vector<uint16_t>*>();
    else if (OffsetCache.is<std::vector<uint32_t>*>())
      delete OffsetCache.get<std::vector<uint32_t>*>();
    else
      delete OffsetCache.get<std::vector<uint64_t>*>();
    OffsetCache = nullptr;
  }
}